

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O1

void tyti::stl::write_ascii<double,std::__cxx11::stringstream>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               basic_solid<double> *s)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  pbVar4 = out + 0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,"solid ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pbVar4,(s->header)._M_dataplus._M_p,(s->header)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  uVar2 = ((long)(s->normals).
                 super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(s->normals).
                 super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar3 = (ulong)(((long)(s->vertices).
                         super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(s->vertices).
                         super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) / 3;
  if (uVar2 <= uVar3) {
    uVar3 = uVar2;
  }
  if (uVar3 != 0) {
    lVar6 = 0;
    uVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,"\tfacet normal ",0xe);
      poVar1 = std::ostream::_M_insert<double>
                         ((s->normals).
                          super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar2].data[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = std::ostream::_M_insert<double>
                         ((s->normals).
                          super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar2].data[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = std::ostream::_M_insert<double>
                         ((s->normals).
                          super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar2].data[2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,"\t\touter loop\n",0xd);
      lVar7 = 3;
      lVar5 = lVar6;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,"\t\t\tvertex ",10);
        poVar1 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)((s->vertices).
                                     super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->data + lVar5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        poVar1 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)((s->vertices).
                                     super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->data + lVar5 + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        poVar1 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)((s->vertices).
                                     super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->data + lVar5 + 0x10
                             ));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        lVar5 = lVar5 + 0x18;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,"\t\tendloop\n",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,"\tendfacet\n",10);
      uVar2 = uVar2 + 1;
      lVar6 = lVar6 + 0x48;
    } while (uVar2 != uVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,"endsolid ",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pbVar4,(s->header)._M_dataplus._M_p,(s->header)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void write_ascii(streamT& out, const basic_solid<T>&s)
        {
            out << "solid " << s.header << "\n";
            
            const size_t num_vertices = std::min(s.normals.size(), s.vertices.size()/3);

            for (size_t i = 0; i < num_vertices; ++i)
            {
                out << "\tfacet normal "
                    << s.normals[i][0] << " "
                    << s.normals[i][1] << " "
                    << s.normals[i][2] << " "
                    << "\n";

                out << "\t\touter loop\n";
                for (size_t j = 0; j < 3; ++j)
                {
                    out << "\t\t\tvertex "
                        << s.vertices[3 * i + j][0] << " "
                        << s.vertices[3 * i + j][1] << " "
                        << s.vertices[3 * i + j][2] << " "
                        << "\n";
                }
                out << "\t\tendloop\n"
                    << "\tendfacet\n";
            }
            out << "endsolid " << s.header << "\n";
        }